

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void variance16_kernel_sse2(uint8_t *src,uint8_t *ref,__m128i *sse,__m128i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  int iVar16;
  int iVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar24 [15];
  unkuint9 Var25;
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  longlong lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  auVar36 = *(undefined1 (*) [16])src;
  auVar1 = *(undefined1 (*) [16])ref;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar36._0_13_;
  auVar2[0xe] = auVar36[7];
  auVar4[0xc] = auVar36[6];
  auVar4._0_12_ = auVar36._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar36._0_11_;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8[10] = auVar36[5];
  auVar8._0_10_ = auVar36._0_10_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10[9] = 0;
  auVar10._0_9_ = auVar36._0_9_;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = auVar36[4];
  auVar12._0_8_ = auVar36._0_8_;
  auVar12._9_6_ = auVar10._9_6_;
  auVar24._7_8_ = 0;
  auVar24._0_7_ = auVar12._8_7_;
  Var25 = CONCAT81(SUB158(auVar24 << 0x40,7),auVar36[3]);
  auVar30._9_6_ = 0;
  auVar30._0_9_ = Var25;
  auVar26._1_10_ = SUB1510(auVar30 << 0x30,5);
  auVar26[0] = auVar36[2];
  auVar31._11_4_ = 0;
  auVar31._0_11_ = auVar26;
  auVar14[2] = auVar36[1];
  auVar14._0_2_ = auVar36._0_2_;
  auVar14._3_12_ = SUB1512(auVar31 << 0x20,3);
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar1._0_13_;
  auVar3[0xe] = auVar1[7];
  auVar5[0xc] = auVar1[6];
  auVar5._0_12_ = auVar1._0_12_;
  auVar5._13_2_ = auVar3._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar1._0_11_;
  auVar7._12_3_ = auVar5._12_3_;
  auVar9[10] = auVar1[5];
  auVar9._0_10_ = auVar1._0_10_;
  auVar9._11_4_ = auVar7._11_4_;
  auVar11[9] = 0;
  auVar11._0_9_ = auVar1._0_9_;
  auVar11._10_5_ = auVar9._10_5_;
  auVar13[8] = auVar1[4];
  auVar13._0_8_ = auVar1._0_8_;
  auVar13._9_6_ = auVar11._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar13._8_7_;
  Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar1[3]);
  auVar32._9_6_ = 0;
  auVar32._0_9_ = Var28;
  auVar29._1_10_ = SUB1510(auVar32 << 0x30,5);
  auVar29[0] = auVar1[2];
  auVar33._11_4_ = 0;
  auVar33._0_11_ = auVar29;
  auVar15[2] = auVar1[1];
  auVar15._0_2_ = auVar1._0_2_;
  auVar15._3_12_ = SUB1512(auVar33 << 0x20,3);
  auVar37._0_2_ = (auVar36._0_2_ & 0xff) - (auVar1._0_2_ & 0xff);
  auVar37._2_2_ = auVar14._2_2_ - auVar15._2_2_;
  auVar37._4_2_ = auVar26._0_2_ - auVar29._0_2_;
  auVar37._6_2_ = (short)Var25 - (short)Var28;
  auVar37._8_2_ = auVar12._8_2_ - auVar13._8_2_;
  auVar37._10_2_ = auVar8._10_2_ - auVar9._10_2_;
  auVar37._12_2_ = auVar4._12_2_ - auVar5._12_2_;
  auVar37._14_2_ = (auVar2._13_2_ >> 8) - (auVar3._13_2_ >> 8);
  auVar35._0_2_ = (ushort)auVar36[8] - (ushort)auVar1[8];
  auVar35._2_2_ = (ushort)auVar36[9] - (ushort)auVar1[9];
  auVar35._4_2_ = (ushort)auVar36[10] - (ushort)auVar1[10];
  auVar35._6_2_ = (ushort)auVar36[0xb] - (ushort)auVar1[0xb];
  auVar35._8_2_ = (ushort)auVar36[0xc] - (ushort)auVar1[0xc];
  auVar35._10_2_ = (ushort)auVar36[0xd] - (ushort)auVar1[0xd];
  auVar35._12_2_ = (ushort)auVar36[0xe] - (ushort)auVar1[0xe];
  auVar35._14_2_ = (ushort)auVar36[0xf] - (ushort)auVar1[0xf];
  auVar36 = pmaddwd(auVar37,auVar37);
  iVar16 = *(int *)((long)*sse + 4);
  lVar34 = (*sse)[1];
  iVar17 = *(int *)((long)*sse + 0xc);
  *(int *)*sse = auVar36._0_4_ + (int)(*sse)[0];
  *(int *)((long)*sse + 4) = auVar36._4_4_ + iVar16;
  *(int *)(*sse + 1) = auVar36._8_4_ + (int)lVar34;
  *(int *)((long)*sse + 0xc) = auVar36._12_4_ + iVar17;
  sVar18 = *(short *)((long)*sum + 2);
  sVar19 = *(short *)((long)*sum + 4);
  sVar20 = *(short *)((long)*sum + 6);
  lVar34 = (*sum)[1];
  sVar21 = *(short *)((long)*sum + 10);
  sVar22 = *(short *)((long)*sum + 0xc);
  sVar23 = *(short *)((long)*sum + 0xe);
  *(short *)*sum = auVar37._0_2_ + (short)(*sum)[0];
  *(short *)((long)*sum + 2) = auVar37._2_2_ + sVar18;
  *(short *)((long)*sum + 4) = auVar37._4_2_ + sVar19;
  *(short *)((long)*sum + 6) = auVar37._6_2_ + sVar20;
  *(short *)(*sum + 1) = auVar37._8_2_ + (short)lVar34;
  *(short *)((long)*sum + 10) = auVar37._10_2_ + sVar21;
  *(short *)((long)*sum + 0xc) = auVar37._12_2_ + sVar22;
  *(short *)((long)*sum + 0xe) = auVar37._14_2_ + sVar23;
  auVar36 = pmaddwd(auVar35,auVar35);
  iVar16 = *(int *)((long)*sse + 4);
  lVar34 = (*sse)[1];
  iVar17 = *(int *)((long)*sse + 0xc);
  *(int *)*sse = auVar36._0_4_ + (int)(*sse)[0];
  *(int *)((long)*sse + 4) = auVar36._4_4_ + iVar16;
  *(int *)(*sse + 1) = auVar36._8_4_ + (int)lVar34;
  *(int *)((long)*sse + 0xc) = auVar36._12_4_ + iVar17;
  sVar18 = *(short *)((long)*sum + 2);
  sVar19 = *(short *)((long)*sum + 4);
  sVar20 = *(short *)((long)*sum + 6);
  lVar34 = (*sum)[1];
  sVar21 = *(short *)((long)*sum + 10);
  sVar22 = *(short *)((long)*sum + 0xc);
  sVar23 = *(short *)((long)*sum + 0xe);
  *(short *)*sum = auVar35._0_2_ + (short)(*sum)[0];
  *(short *)((long)*sum + 2) = auVar35._2_2_ + sVar18;
  *(short *)((long)*sum + 4) = auVar35._4_2_ + sVar19;
  *(short *)((long)*sum + 6) = auVar35._6_2_ + sVar20;
  *(short *)(*sum + 1) = auVar35._8_2_ + (short)lVar34;
  *(short *)((long)*sum + 10) = auVar35._10_2_ + sVar21;
  *(short *)((long)*sum + 0xc) = auVar35._12_2_ + sVar22;
  *(short *)((long)*sum + 0xe) = auVar35._14_2_ + sVar23;
  return;
}

Assistant:

static inline void variance16_kernel_sse2(const uint8_t *const src,
                                          const uint8_t *const ref,
                                          __m128i *const sse,
                                          __m128i *const sum) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i s = _mm_loadu_si128((const __m128i *)src);
  const __m128i r = _mm_loadu_si128((const __m128i *)ref);
  const __m128i src0 = _mm_unpacklo_epi8(s, zero);
  const __m128i ref0 = _mm_unpacklo_epi8(r, zero);
  const __m128i src1 = _mm_unpackhi_epi8(s, zero);
  const __m128i ref1 = _mm_unpackhi_epi8(r, zero);

  variance_kernel_sse2(src0, ref0, sse, sum);
  variance_kernel_sse2(src1, ref1, sse, sum);
}